

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

int __thiscall
BattleWithLandlord::AlphaBeta
          (BattleWithLandlord *this,int depth,int alpha,int beta,
          list<CardStyle,_std::allocator<CardStyle>_> *pv)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  iterator pattern;
  iterator this_00;
  reference __x;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  list<CardStyle,_std::allocator<CardStyle>_> *in_RDI;
  size_type in_R8;
  CardStyle *s;
  iterator __end1;
  iterator __begin1;
  vector<CardStyle,_std::allocator<CardStyle>_> *__range1;
  CardStyle last;
  list<CardStyle,_std::allocator<CardStyle>_> line;
  int value;
  int score;
  int v;
  vector<CardStyle,_std::allocator<CardStyle>_> strategies;
  BattleWithLandlord *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  BattleWithLandlord *this_01;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  BattleWithLandlord *in_stack_ffffffffffffff50;
  __node_base in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffe0;
  int local_4;
  
  if (((ulong)in_RDI[0x10].super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl._M_node.
              super__List_node_base._M_prev & 0x100) == 0) {
    GenStrategy(in_stack_ffffffffffffff08);
    sVar3 = std::multiset<char,_std::less<char>,_std::allocator<char>_>::size
                      ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x1237e3);
    if (((sVar3 == 0) ||
        (sVar3 = std::multiset<char,_std::less<char>,_std::allocator<char>_>::size
                           ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x12380e),
        sVar3 == 0)) ||
       ((in_ESI < 1 &&
        (sVar4 = std::vector<CardStyle,_std::allocator<CardStyle>_>::size
                           ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                            &stack0xffffffffffffffc0), 1 < sVar4)))) {
      local_4 = Evaluate((BattleWithLandlord *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (*(int *)&in_RDI[0xc].super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
                   _M_node.super__List_node_base._M_prev != 0) {
        local_4 = -local_4;
      }
    }
    else {
      std::__cxx11::list<CardStyle,_std::allocator<CardStyle>_>::list
                ((list<CardStyle,_std::allocator<CardStyle>_> *)0x1238cb);
      CardStyle::CardStyle
                ((CardStyle *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (CardStyle *)in_stack_ffffffffffffff08);
      this_01 = (BattleWithLandlord *)&stack0xffffffffffffffc0;
      pattern = std::vector<CardStyle,_std::allocator<CardStyle>_>::begin
                          ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                           in_stack_ffffffffffffff08);
      this_00 = std::vector<CardStyle,_std::allocator<CardStyle>_>::end
                          ((vector<CardStyle,_std::allocator<CardStyle>_> *)
                           in_stack_ffffffffffffff08);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                (__normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>
                                 *)in_stack_ffffffffffffff08), bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>::
              operator*((__normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>
                         *)&stack0xffffffffffffff38);
        Move(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        CardStyle::operator=
                  ((CardStyle *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (CardStyle *)in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff14 =
             AlphaBeta((BattleWithLandlord *)CONCAT44(in_ESI,in_EDX),in_ECX,
                       (int)in_stack_ffffffffffffffe0,(int)(in_R8 >> 0x20),
                       (list<CardStyle,_std::allocator<CardStyle>_> *)
                       in_stack_ffffffffffffffd0._M_nxt);
        iVar2 = -in_stack_ffffffffffffff14;
        Unmove(this_01,(multiset<char,_std::less<char>,_std::allocator<char>_> *)pattern._M_current)
        ;
        local_4 = in_ECX;
        if (in_ECX < iVar2) goto LAB_00123abd;
        if (in_EDX < iVar2) {
          std::__cxx11::list<CardStyle,_std::allocator<CardStyle>_>::operator=
                    ((list<CardStyle,_std::allocator<CardStyle>_> *)this_00._M_current,
                     (list<CardStyle,_std::allocator<CardStyle>_> *)__x);
          std::__cxx11::list<CardStyle,_std::allocator<CardStyle>_>::push_front
                    (in_RDI,(value_type *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          in_EDX = iVar2;
        }
        if (29000 < in_EDX) break;
        __gnu_cxx::
        __normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>::
        operator++((__normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_>
                    *)&stack0xffffffffffffff38);
      }
      CardStyle::operator=
                ((CardStyle *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (CardStyle *)in_stack_ffffffffffffff08);
      local_4 = in_EDX;
LAB_00123abd:
      CardStyle::~CardStyle((CardStyle *)0x123ac7);
      std::__cxx11::list<CardStyle,_std::allocator<CardStyle>_>::~list
                ((list<CardStyle,_std::allocator<CardStyle>_> *)0x123ad4);
    }
    std::vector<CardStyle,_std::allocator<CardStyle>_>::~vector
              ((vector<CardStyle,_std::allocator<CardStyle>_> *)in_RDI);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BattleWithLandlord::AlphaBeta(int depth, int alpha, int beta, list<CardStyle> &pv) {
    {
        // std::lock_guard<std::mutex> lck(_mtx);
        if (_stopsearch) return 0;
    }

#if USE_HASHMAP
    if (_hash.find(_cards[_side], _cards[1-_side], _last, depth)) {
        auto val = _hash.get();
        pv = val.path;
        return val.score;
        // else continue alpha-beta search
    }
#endif

    auto strategies = GenStrategy();

    if (!_cards[_side].size() || !_cards[1-_side].size() || 
        depth <= 0 && strategies.size() > 1) {
        
        auto v = Evaluate();
        int score = _side ? -v: v;
        return score;
    }

    int value;
    list<CardStyle> line;


    CardStyle last = _last;
    for (auto &s: strategies) {
        Move(s.pattern);
        _last = s;
        value = -AlphaBeta(depth-1, -beta, -alpha, line);
        Unmove(s.pattern);

        if (value > beta) {
            return beta;
        }
        if (value > alpha) {
            alpha = value;
            pv = line;
            pv.push_front(s);
        }
// #if !USE_HASHMAP
        if (alpha > WIN_SCORE) break;
// #endif
    }
#if USE_HASHMAP
    if (depth == _max_depth && (alpha > WIN_SCORE || alpha < -WIN_SCORE )) {
        _hash.put(_cards[_side], _cards[1-_side], last, pv, depth, alpha);
    } 
#endif

    _last = last;
    return alpha; 
}